

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O0

int32_t * protobuf_test_messages_proto2_TestAllTypesProto2_repeated_int32
                    (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,size_t *size)

{
  upb_Array *array;
  upb_Array *arr;
  upb_MiniTableField field;
  size_t *size_local;
  protobuf_test_messages_proto2_TestAllTypesProto2 *msg_local;
  
  stack0xffffffffffffffd4 = 0x1500000001f;
  field.number_dont_copy_me__upb_internal_use_only = 0xc105ffff;
  field._4_8_ = size;
  array = upb_Message_GetArray
                    (&msg->base_dont_copy_me__upb_internal_use_only,
                     (upb_MiniTableField *)((long)&arr + 4));
  if (array == (upb_Array *)0x0) {
    if (field._4_8_ != 0) {
      *(undefined8 *)field._4_8_ = 0;
    }
    msg_local = (protobuf_test_messages_proto2_TestAllTypesProto2 *)0x0;
  }
  else {
    if (field._4_8_ != 0) {
      *(size_t *)field._4_8_ = array->size_dont_copy_me__upb_internal_use_only;
    }
    msg_local = (protobuf_test_messages_proto2_TestAllTypesProto2 *)upb_Array_DataPtr(array);
  }
  return (int32_t *)msg_local;
}

Assistant:

UPB_INLINE int32_t const* protobuf_test_messages_proto2_TestAllTypesProto2_repeated_int32(const protobuf_test_messages_proto2_TestAllTypesProto2* msg, size_t* size) {
  const upb_MiniTableField field = {31, UPB_SIZE(64, 336), 0, kUpb_NoSub, 5, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (int32_t const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}